

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

internals * pybind11::detail::get_internals(void)

{
  internals **ppiVar1;
  int iVar2;
  internals *piVar3;
  long lVar4;
  Py_tss_t *pPVar5;
  PyTypeObject *pPVar6;
  PyObject *pPVar7;
  gil_scoped_acquire_local gil;
  dict state_dict;
  object local_50;
  object internals_obj;
  error_scope err_scope;
  
  if ((get_internals_pp()::internals_pp != (internals **)0x0) &&
     (*get_internals_pp()::internals_pp != (internals *)0x0)) {
    return *get_internals_pp()::internals_pp;
  }
  gil.state = PyGILState_Ensure();
  error_scope::error_scope(&err_scope);
  get_python_state_dict();
  dict::dict(&state_dict,&internals_obj);
  object::~object(&internals_obj);
  internals_obj.super_handle.m_ptr =
       (handle)dict_getitemstringref
                         ((PyObject *)state_dict.super_object.super_handle.m_ptr,
                          "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
  if (internals_obj.super_handle.m_ptr != (PyObject *)0x0) {
    get_internals_pp()::internals_pp = get_internals_pp_from_capsule(internals_obj.super_handle);
  }
  object::~object(&internals_obj);
  if (get_internals_pp()::internals_pp == (internals **)0x0) {
    get_internals_pp()::internals_pp = (internals **)operator_new(8);
    *get_internals_pp()::internals_pp = (internals *)0x0;
  }
  else {
    piVar3 = *get_internals_pp()::internals_pp;
    if (piVar3 != (internals *)0x0) goto LAB_0011db66;
  }
  ppiVar1 = get_internals_pp()::internals_pp;
  piVar3 = (internals *)operator_new(0x1d8);
  memset(piVar3,0,0x1d8);
  internals::internals(piVar3);
  *ppiVar1 = piVar3;
  lVar4 = PyThreadState_Get();
  pPVar5 = (Py_tss_t *)PyThread_tss_alloc();
  (*ppiVar1)->tstate = pPVar5;
  if ((pPVar5 == (Py_tss_t *)0x0) || (iVar2 = PyThread_tss_create((*ppiVar1)->tstate), iVar2 != 0))
  {
    pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
  }
  PyThread_tss_set((*ppiVar1)->tstate,lVar4);
  (*ppiVar1)->istate = *(PyInterpreterState **)(lVar4 + 0x10);
  capsule::capsule((capsule *)&local_50,get_internals_pp()::internals_pp,(char *)0x0,
                   (PyCapsule_Destructor)0x0);
  object_api<pybind11::handle>::operator[]
            ((item_accessor *)&internals_obj,(object_api<pybind11::handle> *)&state_dict,
             "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
  accessor<pybind11::detail::accessor_policies::generic_item>::operator=
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)&internals_obj,
             (capsule *)&local_50);
  accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)&internals_obj);
  object::~object(&local_50);
  internals_obj.super_handle.m_ptr = (handle)translate_exception;
  std::
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ::push_front(&(*ppiVar1)->registered_exception_translators,
               (_func_void_exception_ptr **)&internals_obj);
  pPVar6 = make_static_property_type();
  (*ppiVar1)->static_property_type = pPVar6;
  pPVar6 = make_default_metaclass();
  (*ppiVar1)->default_metaclass = pPVar6;
  pPVar7 = make_object_base_type((*ppiVar1)->default_metaclass);
  (*ppiVar1)->instance_base = pPVar7;
  piVar3 = *get_internals_pp()::internals_pp;
LAB_0011db66:
  object::~object(&state_dict.super_object);
  error_scope::~error_scope(&err_scope);
  get_internals::gil_scoped_acquire_local::~gil_scoped_acquire_local(&gil);
  return piVar3;
}

Assistant:

PYBIND11_NOINLINE internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp) {
        return **internals_pp;
    }

#if defined(PYBIND11_SIMPLE_GIL_MANAGEMENT)
    gil_scoped_acquire gil;
#else
    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state(PyGILState_Ensure()) {}
        gil_scoped_acquire_local(const gil_scoped_acquire_local &) = delete;
        gil_scoped_acquire_local &operator=(const gil_scoped_acquire_local &) = delete;
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;
#endif
    error_scope err_scope;

    dict state_dict = get_python_state_dict();
    if (object internals_obj = get_internals_obj_from_state_dict(state_dict)) {
        internals_pp = get_internals_pp_from_capsule(internals_obj);
    }
    if (internals_pp && *internals_pp) {
        // We loaded the internals through `state_dict`, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
        // libc++ with CPython doesn't require this (types are explicitly exported)
        // libc++ with PyPy still need it, awaiting further investigation
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(&translate_local_exception);
#endif
    } else {
        if (!internals_pp) {
            internals_pp = new internals *();
        }
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();

        PyThreadState *tstate = PyThreadState_Get();
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->tstate)) {
            pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
        }
        PYBIND11_TLS_REPLACE_VALUE(internals_ptr->tstate, tstate);

#if PYBIND11_INTERNALS_VERSION > 4
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->loader_life_support_tls_key)) {
            pybind11_fail("get_internals: could not successfully initialize the "
                          "loader_life_support TSS key!");
        }
#endif
        internals_ptr->istate = tstate->interp;
        state_dict[PYBIND11_INTERNALS_ID] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(&translate_exception);
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
#ifdef Py_GIL_DISABLED
        // Scale proportional to the number of cores. 2x is a heuristic to reduce contention.
        auto num_shards
            = static_cast<size_t>(round_up_to_next_pow2(2 * std::thread::hardware_concurrency()));
        if (num_shards == 0) {
            num_shards = 1;
        }
        internals_ptr->instance_shards.reset(new instance_map_shard[num_shards]);
        internals_ptr->instance_shards_mask = num_shards - 1;
#endif // Py_GIL_DISABLED
    }
    return **internals_pp;
}